

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# okim6295.c
# Opt level: O3

UINT8 device_start_okim6295(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  uint uVar1;
  DEV_DATA DVar2;
  UINT8 UVar3;
  uint uVar4;
  long lVar5;
  okim6295_state *chip;
  
  DVar2.chipInf = calloc(1,0x100);
  if ((DEV_DATA *)DVar2.chipInf == (DEV_DATA *)0x0) {
    UVar3 = 0xff;
  }
  else {
    lVar5 = 8;
    do {
      oki_adpcm_init((oki_adpcm_state *)((long)DVar2.chipInf + lVar5),(INT8 *)0x0,(INT16 *)0x0);
      lVar5 = lVar5 + 0x30;
    } while (lVar5 != 200);
    *(undefined2 *)&((DEV_DATA *)((long)DVar2.chipInf + 200))->chipInf = 0xffff;
    *(undefined4 *)((long)DVar2.chipInf + 0xcc) = 0;
    *(undefined1 *)((long)DVar2.chipInf + 0xd2) = 0;
    *(undefined4 *)((long)DVar2.chipInf + 0xd3) = 0;
    ((DEV_DATA *)((long)DVar2.chipInf + 0xe8))->chipInf = (void *)0x0;
    *(undefined4 *)&((DEV_DATA *)((long)DVar2.chipInf + 0xe0))->chipInf = 0;
    uVar1 = cfg->clock;
    *(uint *)((long)DVar2.chipInf + 0xdc) = uVar1;
    UVar3 = cfg->flags;
    *(UINT8 *)((long)DVar2.chipInf + 0xd1) = UVar3;
    ((DEV_DATA *)((long)DVar2.chipInf + 0xf0))->chipInf = (void *)0x0;
    *(uint *)&((DEV_DATA *)((long)DVar2.chipInf + 0xd8))->chipInf = uVar1;
    *(UINT8 *)&((DEV_DATA *)((long)DVar2.chipInf + 0xd0))->chipInf = UVar3;
    lVar5 = 0x34;
    do {
      *(undefined1 *)((long)DVar2.chipInf + lVar5) = 0;
      lVar5 = lVar5 + 0x30;
    } while (lVar5 != 0xf4);
    uVar4 = 0x84;
    if (UVar3 == '\0') {
      uVar4 = 0xa5;
    }
    *(void **)DVar2.chipInf = DVar2.chipInf;
    UVar3 = '\0';
    retDevInf->dataPtr = (DEV_DATA *)DVar2.chipInf;
    retDevInf->sampleRate = uVar1 / uVar4;
    retDevInf->devDef = &devDef;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
  }
  return UVar3;
}

Assistant:

static UINT8 device_start_okim6295(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	okim6295_state *info;
	UINT32 divisor;
	int voicenum;

	info = (okim6295_state *)calloc(1, sizeof(okim6295_state));
	if (info == NULL)
		return 0xFF;

	for (voicenum = 0; voicenum < OKIM6295_VOICES; voicenum++)
		oki_adpcm_init(&info->voice[voicenum].adpcm, NULL, NULL);

	info->command = -1;
	info->bank_offs = 0;
	info->nmk_mode = 0x00;
	memset(info->nmk_bank, 0x00, 4 * sizeof(UINT8));
	info->ROM = NULL;
	info->ROMSize = 0x00;

	info->initial_clock = cfg->clock;
	info->pin7_initial = cfg->flags;
	info->SmpRateFunc = NULL;

	info->master_clock = info->initial_clock;
	info->pin7_state = info->pin7_initial;
	divisor = info->pin7_state ? 132 : 165;

	okim6295_set_mute_mask(info, 0x00);
	
	info->_devData.chipInf = info;
	INIT_DEVINF(retDevInf, &info->_devData, info->master_clock / divisor, &devDef);
	return 0x00;
}